

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long passthrough_resampler_fill_input_left
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  int iVar1;
  int *in_RSI;
  long in_R8;
  anon_class_16_2_bcd3ee38 *unaff_retaddr;
  anon_class_16_2_bcd3ee38 *in_stack_00000020;
  int iteration;
  
  iVar1 = *in_RSI;
  if (iVar1 == 1) {
    passthrough_resampler_fill_input_left::anon_class_16_2_bcd3ee38::operator()(unaff_retaddr);
  }
  else if (iVar1 == 2) {
    passthrough_resampler_fill_input_left::anon_class_16_2_bcd3ee38::operator()(in_stack_00000020);
  }
  else if (iVar1 == 3) {
    passthrough_resampler_fill_input_left::anon_class_16_2_bcd3ee38::operator()
              ((anon_class_16_2_bcd3ee38 *)nframes);
  }
  return in_R8;
}

Assistant:

static long
passthrough_resampler_fill_input_left(cubeb_stream * stream,
                                     void * user_ptr,
                                     void const * input_buffer,
                                     void * output_buffer,
                                     long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  int iteration = *static_cast<int*>(user_ptr);
  if (iteration == 1) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 64; ++i) {
        ASSERT_FLOAT_EQ(input[i], 0.01 * i);
      }
    }();
  } else if (iteration == 2) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part contains the reamaining input samples from previous
        // iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 64));
        // next part contains the new buffer
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
      }
    }();
  } else if (iteration == 3) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part (16 frames) contains the reamaining input samples
        // from previous iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 32));
      }
      for (int i = 0; i < 16; ++i) {
        // next part (8 frames) contains the new input buffer.
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
        // last part (8 frames) contains silence.
        ASSERT_FLOAT_EQ(input[i + 32 + 16], 0.0);
      }
    }();
  }
  return nframes;
}